

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.hpp
# Opt level: O1

void * __thiscall tcmalloc::ThreadCache::Alloc(ThreadCache *this,size_t size,uint64_t cl)

{
  long lVar1;
  uint uVar2;
  uint64_t uVar3;
  undefined8 *unaff_R14;
  ThreadCacheFreeList *fl;
  
  if (cl - 1 < 0x55) {
    fl = this->freelists_ + cl;
    uVar3 = (fl->list_).free_count_;
    if (uVar3 != 0) {
      unaff_R14 = (undefined8 *)this->freelists_[cl].list_.head_;
      this->freelists_[cl].list_.head_ = (void *)*unaff_R14;
      (fl->list_).free_count_ = uVar3 - 1;
      uVar2 = (uint)(uVar3 - 1);
      if (uVar2 < this->freelists_[cl].lowater_) {
        this->freelists_[cl].lowater_ = uVar2;
      }
    }
    if (uVar3 == 0) {
      FetchFromCentralCache(this,fl);
      uVar3 = (fl->list_).free_count_;
      if (uVar3 != 0) {
        unaff_R14 = (undefined8 *)this->freelists_[cl].list_.head_;
        this->freelists_[cl].list_.head_ = (void *)*unaff_R14;
        uVar3 = uVar3 - 1;
        (fl->list_).free_count_ = uVar3;
        uVar2 = (uint)uVar3;
        if (uVar2 < this->freelists_[cl].lowater_) {
          this->freelists_[cl].lowater_ = uVar2;
        }
      }
    }
    lVar1 = (&SizeClasses)[cl * 3];
    this->size_ = this->size_ - lVar1;
    this->total_alloc_ = this->total_alloc_ + lVar1;
    return unaff_R14;
  }
  __assert_fail("0 < cl && cl < kMaxClass",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/thread_cache.hpp"
                ,0x25,"void *tcmalloc::ThreadCache::Alloc(size_t, uint64_t)");
}

Assistant:

void* Alloc(size_t size, uint64_t cl) {
        assert(0 < cl && cl < kMaxClass);
        void* rv;
        if (!freelists_[cl].TryPop(&rv)) {
            FetchFromCentralCache(freelists_[cl]);
            freelists_[cl].TryPop(&rv);
        }
        size = ClassSize(cl);
        size_ -= size;
        total_alloc_ += size;
        return rv;
    }